

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utScenePreprocessor.cpp
# Opt level: O2

void __thiscall
ScenePreprocessorTest_testMeshPreprocessingNeg_Test::
ScenePreprocessorTest_testMeshPreprocessingNeg_Test
          (ScenePreprocessorTest_testMeshPreprocessingNeg_Test *this)

{
  ScenePreprocessorTest::ScenePreprocessorTest(&this->super_ScenePreprocessorTest);
  (this->super_ScenePreprocessorTest).super_Test._vptr_Test = (_func_int **)&PTR__Test_0080b110;
  return;
}

Assistant:

TEST_F(ScenePreprocessorTest, testMeshPreprocessingNeg) {
    aiMesh* p = new aiMesh;
    p->mPrimitiveTypes = aiPrimitiveType_TRIANGLE|aiPrimitiveType_POLYGON;
    ProcessMesh(p);

    // should be unmodified
    EXPECT_EQ(static_cast<unsigned int>(aiPrimitiveType_TRIANGLE|aiPrimitiveType_POLYGON),
              p->mPrimitiveTypes);

    delete p;
}